

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForLoopStatementSyntax *syntax)

{
  Compilation *compilation;
  size_t sVar1;
  SyntaxNode *syntax_00;
  SourceLocation defaultLoc;
  ForVariableDeclarationSyntax *syntax_01;
  VariableSymbol *lastVar;
  Scope *scope_00;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar2;
  const_iterator __begin2;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffff90;
  iterator_base<const_slang::syntax::SyntaxNode_*> local_68;
  StatementBlockSymbol *local_58;
  ForLoopStatementSyntax *local_50;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> local_48;
  
  defaultLoc = parsing::Token::location(&syntax->forKeyword);
  getLabel(&local_48,&syntax->super_StatementSyntax,defaultLoc);
  local_58 = createBlock((ast *)scope,(Scope *)syntax,(StatementSyntax *)local_48.first._M_len,
                         (string_view)local_48._8_16_,(SourceLocation)0x0,Sequential,
                         (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffff90);
  compilation = scope->compilation;
  local_68.index = 0;
  sVar1 = (syntax->initializers).elements._M_extent._M_extent_value;
  scope_00 = &local_58->super_Scope;
  lastVar = (VariableSymbol *)0x0;
  local_68.list = &syntax->initializers;
  local_50 = syntax;
  for (; (local_68.list != &syntax->initializers || (local_68.index != sVar1 + 1 >> 1));
      local_68.index = local_68.index + 1) {
    syntax_01 = (ForVariableDeclarationSyntax *)
                slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>::
                iterator_base<const_slang::syntax::SyntaxNode_*>::dereference(&local_68);
    syntax_00 = (syntax_01->super_SyntaxNode).previewNode;
    if (syntax_00 != (SyntaxNode *)0x0) {
      Scope::addMembers(scope_00,syntax_00);
    }
    lastVar = VariableSymbol::fromSyntax(compilation,syntax_01,lastVar);
    Scope::addMember(scope_00,(Symbol *)lastVar);
  }
  sVar2 = Statement::createAndAddBlockItems(scope_00,(local_50->statement).ptr,false);
  local_58->blocks = sVar2;
  return local_58;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.forKeyword.location());
    auto result = createBlock(scope, syntax, name, loc);

    // If one entry is a variable declaration, they must all be.
    // We'll only enter this function if we have variable decls.
    auto& comp = scope.getCompilation();
    const VariableSymbol* lastVar = nullptr;
    for (auto init : syntax.initializers) {
        if (init->previewNode)
            result->addMembers(*init->previewNode);

        auto& var = VariableSymbol::fromSyntax(comp, init->as<ForVariableDeclarationSyntax>(),
                                               lastVar);

        lastVar = &var;
        result->addMember(var);
    }

    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);
    return *result;
}